

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_tables.c
# Opt level: O2

void write_parser_tables(Grammar *g,char *tag,File *file)

{
  byte *pbVar1;
  int iVar2;
  Rule **ppRVar3;
  Rule *pRVar4;
  Code *pCVar5;
  Code *pCVar6;
  State *pSVar7;
  ScanStateTransition *pSVar8;
  Action *pAVar9;
  ScanState **ppSVar10;
  ScanState *pSVar11;
  Elem *pEVar12;
  D_Pass *pDVar13;
  uint8 **ppuVar14;
  OffsetEntry **__ptr;
  byte bVar15;
  int iVar16;
  uint uVar17;
  Production *pPVar18;
  Term *pTVar19;
  void *pvVar20;
  void *pvVar21;
  char *pcVar22;
  CopyFuncType p_Var23;
  Action *pAVar24;
  uint *puVar25;
  State *pSVar26;
  Hint *pHVar27;
  char *pcVar28;
  size_t sVar29;
  FILE *pFVar30;
  uint8 *puVar31;
  Production *pPVar32;
  ulong uVar33;
  Rule *pRVar34;
  Rule *pRVar35;
  undefined4 uVar36;
  OffsetEntry *pOVar37;
  char *extraout_RDX;
  long lVar38;
  char *extraout_RDX_00;
  long lVar39;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  undefined8 uVar40;
  char *extraout_RDX_05;
  char *extraout_RDX_06;
  uint uVar41;
  uint *puVar42;
  uint uVar43;
  void **ppvVar44;
  short *psVar45;
  char **ppcVar46;
  int *piVar47;
  FILE *pFVar48;
  uint uVar49;
  ulong uVar50;
  ulong uVar51;
  char *pcVar52;
  ulong uVar53;
  long lVar54;
  void *t;
  uint uVar55;
  bool bVar56;
  int local_574;
  VecState er_hash;
  char final_code [256];
  char speculative_code [256];
  char pass_code [256];
  char fname [256];
  char local_138 [8];
  undefined1 *local_130;
  undefined1 local_128 [248];
  
  er_hash.n = 0;
  er_hash.v = (State **)0x0;
  g->scanner_block_size = (int)(0x100 / (long)g->scanner_blocks);
  pFVar48 = file->fp;
  pPVar18 = lookup_production(g,"_",1);
  if (pPVar18 == (Production *)0x0) {
    pRVar35 = (Rule *)0x0;
  }
  else {
    pRVar35 = *(pPVar18->rules).v;
    myfprintf(pFVar48,"int d_speculative_reduction_code_%d_%d_%s%s;\n",(ulong)pRVar35->prod->index,
              (ulong)pRVar35->index,tag,
              "(void *_ps, void **_children, int _n_children, int _offset, D_Parser *_parser)");
    g->write_line = g->write_line + 1;
    myfprintf(pFVar48,"int d_final_reduction_code_%d_%d_%s%s;\n",(ulong)pRVar35->prod->index,
              (ulong)pRVar35->index,tag,
              "(void *_ps, void **_children, int _n_children, int _offset, D_Parser *_parser)");
    g->write_line = g->write_line + 1;
    myfprintf(pFVar48,"extern D_ReductionCode d_pass_code_%d_%d_%s[];\n",(ulong)pRVar35->prod->index
              ,(ulong)pRVar35->index);
    g->write_line = g->write_line + 1;
    for (uVar43 = 0; (int)uVar43 < (int)(pRVar35->pass_code).n; uVar43 = uVar43 + 1) {
      myfprintf(pFVar48,"int d_pass_code_%d_%d_%d_%s%s;\n",(ulong)uVar43,(ulong)pRVar35->prod->index
                ,(ulong)pRVar35->index,tag,
                "(void *_ps, void **_children, int _n_children, int _offset, D_Parser *_parser)");
      g->write_line = g->write_line + 1;
    }
  }
  for (lVar39 = 0; lVar39 < (int)(g->productions).n; lVar39 = lVar39 + 1) {
    pPVar18 = (g->productions).v[lVar39];
    uVar43 = (pPVar18->rules).n;
    uVar49 = uVar43;
LAB_00133ce4:
    uVar49 = uVar49 - 1;
    if (-1 < (int)uVar49) {
      ppRVar3 = (pPVar18->rules).v;
      pRVar34 = ppRVar3[uVar49 & 0x7fffffff];
      for (uVar50 = 0; uVar50 != uVar49; uVar50 = uVar50 + 1) {
        pRVar4 = ppRVar3[uVar50];
        if (((((((pRVar34->elems).n == (pRVar4->elems).n) &&
               ((pRVar34->speculative_code).code == (pRVar4->speculative_code).code)) &&
              ((pRVar34->final_code).code == (pRVar4->final_code).code)) &&
             ((pRVar34->op_priority == pRVar4->op_priority &&
              (pRVar34->op_assoc == pRVar4->op_assoc)))) &&
            ((pRVar34->rule_priority == pRVar4->rule_priority &&
             ((pRVar34->rule_assoc == pRVar4->rule_assoc &&
              (pRVar34->action_index == pRVar4->action_index)))))) &&
           (uVar41 = (pRVar34->pass_code).n, uVar41 == (pRVar4->pass_code).n)) {
          uVar51 = (ulong)uVar41;
          if ((int)uVar41 < 1) {
            uVar51 = 0;
          }
          uVar53 = 0;
          do {
            if (uVar51 == uVar53) {
              pRVar34->same_reduction = pRVar4;
              goto LAB_00133ce4;
            }
            pCVar5 = (pRVar34->pass_code).v[uVar53];
            pCVar6 = (pRVar4->pass_code).v[uVar53];
            if (pCVar5 == (Code *)0x0) {
              if (pCVar6 != (Code *)0x0) break;
            }
            else if ((pCVar6 == (Code *)0x0) || (pCVar5->code != pCVar6->code)) break;
            uVar53 = uVar53 + 1;
          } while( true );
        }
      }
      goto LAB_00133ce4;
    }
    for (lVar38 = 0; lVar38 < (int)uVar43; lVar38 = lVar38 + 1) {
      pRVar34 = (pPVar18->rules).v[lVar38];
      if (pRVar34->same_reduction == (Rule *)0x0) {
        if ((pRVar34->speculative_code).code == (char *)0x0) {
          if ((pRVar35 == (Rule *)0x0) || ((pRVar35->speculative_code).code == (char *)0x0)) {
            speculative_code._4_4_ = speculative_code._4_4_ & 0xffffff00;
            builtin_strncpy(speculative_code,"NULL",4);
            goto LAB_00133e8e;
          }
          snprintf(speculative_code,0xff,"d_speculative_reduction_code_%d_%d_%s",
                   (ulong)pRVar35->prod->index,(ulong)pRVar35->index,tag);
          if ((pRVar34->final_code).code == (char *)0x0) goto LAB_00133eae;
LAB_00133e9b:
          uVar43 = pRVar34->prod->index;
          uVar49 = pRVar34->index;
LAB_00133ebf:
          snprintf(final_code,0xff,"d_final_reduction_code_%d_%d_%s",(ulong)uVar43,(ulong)uVar49,tag
                  );
        }
        else {
          snprintf(speculative_code,0xff,"d_speculative_reduction_code_%d_%d_%s",
                   (ulong)pRVar34->prod->index,(ulong)pRVar34->index,tag);
LAB_00133e8e:
          if ((pRVar34->final_code).code != (char *)0x0) goto LAB_00133e9b;
          if (pRVar35 != (Rule *)0x0) {
LAB_00133eae:
            if ((pRVar35->final_code).code == (char *)0x0) goto LAB_00133edf;
            uVar43 = pRVar35->prod->index;
            uVar49 = pRVar35->index;
            goto LAB_00133ebf;
          }
LAB_00133edf:
          final_code._4_4_ = final_code._4_4_ & 0xffffff00;
          builtin_strncpy(final_code,"NULL",4);
        }
        if ((pRVar34->speculative_code).code != (char *)0x0) {
          snprintf(fname,0xff,"int d_speculative_reduction_code_%d_%d_%s%s ",
                   (ulong)pRVar34->prod->index,(ulong)pRVar34->index,tag,
                   "(void *_ps, void **_children, int _n_children, int _offset, D_Parser *_parser)")
          ;
          write_code(file,g,pRVar34,speculative_code,(pRVar34->speculative_code).code,fname,
                     (pRVar34->speculative_code).line,g->pathname);
        }
        if ((pRVar34->final_code).code != (char *)0x0) {
          snprintf(fname,0xff,"int d_final_reduction_code_%d_%d_%s%s ",(ulong)pRVar34->prod->index,
                   (ulong)pRVar34->index,tag,
                   "(void *_ps, void **_children, int _n_children, int _offset, D_Parser *_parser)")
          ;
          write_code(file,g,pRVar34,final_code,(pRVar34->final_code).code,fname,
                     (pRVar34->final_code).line,g->pathname);
        }
        uVar50 = 0;
        while( true ) {
          uVar43 = (pRVar34->pass_code).n;
          uVar51 = (ulong)(int)uVar43;
          if ((long)uVar51 <= (long)uVar50) break;
          if ((pRVar34->pass_code).v[uVar50] != (Code *)0x0) {
            snprintf(fname,0xff,"int d_pass_code_%d_%d_%d_%s%s ",uVar50 & 0xffffffff,
                     (ulong)pRVar34->prod->index,(ulong)pRVar34->index,tag,
                     "(void *_ps, void **_children, int _n_children, int _offset, D_Parser *_parser)"
                    );
            snprintf(local_138,0xff,"int d_pass_code_%d_%d_%d_%s",uVar50 & 0xffffffff,
                     (ulong)pRVar34->prod->index,(ulong)pRVar34->index,tag);
            pCVar5 = (pRVar34->pass_code).v[uVar50];
            write_code(file,g,pRVar34,local_138,pCVar5->code,fname,pCVar5->line,g->pathname);
          }
          uVar50 = uVar50 + 1;
        }
        if (uVar43 == 0) {
          if (pRVar35 != (Rule *)0x0) {
            uVar43 = (pRVar35->pass_code).n;
            uVar51 = (ulong)uVar43;
            if (uVar43 != 0) {
              if ((int)uVar43 < 1) {
                uVar51 = 0;
              }
              snprintf(pass_code,0xff,"d_pass_code_%d_%d_%s",(ulong)pRVar35->prod->index,
                       (ulong)pRVar35->index,tag);
              goto LAB_0013424b;
            }
          }
          builtin_strncpy(pass_code,"NULL",5);
          uVar51 = 0;
        }
        else {
          if (pRVar35 != (Rule *)0x0) {
            uVar49 = (pRVar35->pass_code).n;
            uVar51 = (ulong)uVar43;
            if ((int)uVar43 < (int)uVar49) {
              uVar51 = (ulong)uVar49;
            }
          }
          snprintf(pass_code,0xff,"d_pass_code_%d_%d_%s",(ulong)pRVar34->prod->index,
                   (ulong)pRVar34->index,tag);
          myfprintf(pFVar48,"D_ReductionCode %s[] = {",pass_code);
          lVar54 = (long)((int)uVar51 + -1);
          uVar50 = 0;
          if (0 < (int)uVar51) {
            uVar50 = uVar51 & 0xffffffff;
          }
          for (uVar53 = 0; uVar50 != uVar53; uVar53 = uVar53 + 1) {
            if (((long)uVar53 < (long)(int)(pRVar34->pass_code).n) &&
               ((pRVar34->pass_code).v[uVar53] != (Code *)0x0)) {
              uVar49 = pRVar34->prod->index;
              uVar43 = pRVar34->index;
LAB_0013415b:
              pcVar52 = "";
              if ((long)uVar53 < lVar54) {
                pcVar52 = ", ";
              }
              myfprintf(pFVar48,"d_pass_code_%d_%d_%d_%s%s",uVar53 & 0xffffffff,(ulong)uVar49,
                        (ulong)uVar43,tag,pcVar52);
            }
            else {
              if ((pRVar35 != (Rule *)0x0) &&
                 (((long)uVar53 < (long)(int)(pRVar35->pass_code).n &&
                  ((pRVar35->pass_code).v[uVar53] != (Code *)0x0)))) {
                uVar49 = pRVar35->prod->index;
                uVar43 = pRVar35->index;
                goto LAB_0013415b;
              }
              pcVar52 = "";
              if ((long)uVar53 < lVar54) {
                pcVar52 = ", ";
              }
              myfprintf(pFVar48,"NULL%s",pcVar52);
            }
          }
          myfprintf(pFVar48,"};\n\n");
          g->write_line = g->write_line + 2;
        }
LAB_0013424b:
        pcVar52 = make_name("d_reduction_%d_%s",(ulong)pRVar34->index,tag);
        start_struct_fn(file,0x38,"D_Reduction",pcVar52,"");
        if (file->binary == 0) {
          handle_comma(file);
          myfprintf(file->fp,"%d",(ulong)(pRVar34->elems).n);
          if (file->binary != 0) {
            pcVar52 = (file->tables).cur;
            goto LAB_001342c9;
          }
          handle_comma(file);
          myfprintf(file->fp,"%d",(ulong)pRVar34->prod->index);
          if (file->binary != 0) {
            pPVar32 = pRVar34->prod;
            goto LAB_001342db;
          }
          myfprintf(pFVar48,", %s",speculative_code);
          myfprintf(pFVar48,", %s",final_code);
        }
        else {
          pcVar52 = (file->tables).cur;
          *(short *)pcVar52 = (short)(pRVar34->elems).n;
LAB_001342c9:
          pPVar32 = pRVar34->prod;
          *(short *)(pcVar52 + 2) = (short)pPVar32->index;
LAB_001342db:
          if ((pPVar32->field_0x3c & 0x1c) == 0) {
            pcVar52 = (file->tables).cur;
            if (pRVar34->action_index < 0) goto LAB_001342e5;
            if (pcVar52 == (char *)0x0) {
              ppvVar44 = (void **)0x0;
            }
            else {
              ppvVar44 = (void **)(pcVar52 + 8);
            }
            add_struct_ptr_member_fn(file,ppvVar44,&spec_code_entry,"%s");
            pcVar52 = (file->tables).cur;
            if (pcVar52 == (char *)0x0) {
              ppvVar44 = (void **)0x0;
            }
            else {
              ppvVar44 = (void **)(pcVar52 + 0x10);
            }
            pOVar37 = &final_code_entry;
          }
          else {
            pcVar52 = (file->tables).cur;
LAB_001342e5:
            if (pcVar52 == (char *)0x0) {
              ppvVar44 = (void **)0x0;
            }
            else {
              ppvVar44 = (void **)(pcVar52 + 8);
            }
            add_struct_ptr_member_fn(file,ppvVar44,&null_entry,"%s");
            pcVar52 = (file->tables).cur;
            if (pcVar52 == (char *)0x0) {
              ppvVar44 = (void **)0x0;
            }
            else {
              ppvVar44 = (void **)(pcVar52 + 0x10);
            }
            pOVar37 = &null_entry;
          }
          add_struct_ptr_member_fn(file,ppvVar44,pOVar37,"%s");
        }
        if (file->binary == 0) {
          handle_comma(file);
          myfprintf(file->fp,"%d",(ulong)pRVar34->op_assoc);
          if (file->binary != 0) {
            pcVar52 = (file->tables).cur;
            goto LAB_0013441a;
          }
          handle_comma(file);
          myfprintf(file->fp,"%d",(ulong)pRVar34->rule_assoc);
          if (file->binary != 0) {
            pcVar52 = (file->tables).cur;
            goto LAB_00134424;
          }
          handle_comma(file);
          myfprintf(file->fp,"%d",(ulong)(uint)pRVar34->op_priority);
          if (file->binary != 0) {
            pcVar52 = (file->tables).cur;
            goto LAB_0013442c;
          }
          handle_comma(file);
          myfprintf(file->fp,"%d",(ulong)(uint)pRVar34->rule_priority);
          if (file->binary != 0) goto LAB_00134434;
          handle_comma(file);
          uVar50 = 0xffffffffffffffff;
          if ((pRVar34->prod->field_0x3c & 0x1c) == 0) {
            uVar50 = (ulong)(uint)pRVar34->action_index;
          }
          myfprintf(file->fp,"%d",uVar50);
          if (file->binary != 0) {
            pcVar52 = (file->tables).cur;
            goto LAB_00134451;
          }
          handle_comma(file);
          myfprintf(file->fp,"%d",uVar51 & 0xffffffff);
          if (file->binary != 0) {
            pcVar52 = (file->tables).cur;
            if (pcVar52 != (char *)0x0) goto LAB_00134455;
            ppvVar44 = (void **)0x0;
            goto LAB_0013445c;
          }
          myfprintf(pFVar48,", %s",pass_code);
          pcVar52 = extraout_RDX_00;
        }
        else {
          pcVar52 = (file->tables).cur;
          *(short *)(pcVar52 + 0x18) = (short)pRVar34->op_assoc;
LAB_0013441a:
          *(short *)(pcVar52 + 0x1a) = (short)pRVar34->rule_assoc;
LAB_00134424:
          *(int *)(pcVar52 + 0x1c) = pRVar34->op_priority;
LAB_0013442c:
          *(int *)(pcVar52 + 0x20) = pRVar34->rule_priority;
LAB_00134434:
          iVar16 = -1;
          if ((pRVar34->prod->field_0x3c & 0x1c) == 0) {
            iVar16 = pRVar34->action_index;
          }
          pcVar52 = (file->tables).cur;
          *(int *)(pcVar52 + 0x24) = iVar16;
LAB_00134451:
          *(int *)(pcVar52 + 0x28) = (int)uVar51;
LAB_00134455:
          ppvVar44 = (void **)(pcVar52 + 0x30);
LAB_0013445c:
          add_struct_ptr_member_fn(file,ppvVar44,&null_entry,"%s");
          pcVar52 = extraout_RDX;
        }
        end_struct_fn(file,0x38,pcVar52);
        g->write_line = g->write_line + 1;
        uVar43 = (pPVar18->rules).n;
      }
    }
  }
  for (uVar50 = 0; uVar50 < (g->terminals).n; uVar50 = uVar50 + 1) {
    pTVar19 = (g->terminals).v[uVar50];
    pPVar18 = pTVar19->regex_production;
    if ((pPVar18 == (Production *)0x0) ||
       (pRVar35 = *(pPVar18->rules).v, (pRVar35->speculative_code).code == (char *)0x0)) {
      final_code._4_4_ = final_code._4_4_ & 0xffffff00;
      builtin_strncpy(final_code,"NULL",4);
    }
    else {
      if (file->binary != 0) {
        __assert_fail("!fp->binary",
                      "/workspace/llm4binary/github/license_c_cmakelists/jplevyak[P]dparser/write_tables.c"
                      ,0x24d,"void write_scanner_data(File *, Grammar *, char *)");
      }
      snprintf(final_code,0xff,"d_speculative_reduction_code_%d_%d_%s",(ulong)pPVar18->index,
               (ulong)pRVar35->index,tag);
      pPVar18 = pTVar19->regex_production;
    }
    iVar16 = -1;
    if (pPVar18 != (Production *)0x0) {
      iVar16 = (*(pPVar18->rules).v)->action_index;
    }
    pcVar52 = make_name("d_shift_%d_%s",uVar50 & 0xffffffff,tag);
    start_struct_fn(file,0x18,"D_Shift",pcVar52,"");
    if (file->binary == 0) {
      handle_comma(file);
      myfprintf(file->fp,"%d",(ulong)((g->productions).n + (g->terminals).v[uVar50]->index));
      if (file->binary != 0) {
        pTVar19 = (g->terminals).v[uVar50];
        psVar45 = (short *)(file->tables).cur;
        goto LAB_00134778;
      }
      handle_comma(file);
      myfprintf(file->fp,"%d",(ulong)((byte)(g->terminals).v[uVar50]->field_0x2c & 7));
      if (file->binary != 0) {
        pTVar19 = (g->terminals).v[uVar50];
        psVar45 = (short *)(file->tables).cur;
        goto LAB_00134781;
      }
      handle_comma(file);
      myfprintf(file->fp,"%d",(ulong)(g->terminals).v[uVar50]->op_assoc);
      if (file->binary != 0) {
        pTVar19 = (g->terminals).v[uVar50];
        psVar45 = (short *)(file->tables).cur;
        goto LAB_00134787;
      }
      handle_comma(file);
      myfprintf(file->fp,"%d",(ulong)(uint)(g->terminals).v[uVar50]->op_priority);
      if (file->binary != 0) {
        pTVar19 = (g->terminals).v[uVar50];
        psVar45 = (short *)(file->tables).cur;
        goto LAB_0013478d;
      }
      handle_comma(file);
      myfprintf(file->fp,"%d",(ulong)(uint)(g->terminals).v[uVar50]->term_priority);
      if (file->binary != 0) {
        psVar45 = (short *)(file->tables).cur;
        goto LAB_00134793;
      }
      handle_comma(file);
      myfprintf(file->fp,"%d",0);
      myfprintf(file->fp,", %s",final_code);
      pcVar52 = extraout_RDX_03;
    }
    else {
      pTVar19 = (g->terminals).v[uVar50];
      psVar45 = (short *)(file->tables).cur;
      *psVar45 = (short)(g->productions).n + (short)pTVar19->index;
LAB_00134778:
      *(byte *)(psVar45 + 1) = pTVar19->field_0x2c & 7;
LAB_00134781:
      *(char *)((long)psVar45 + 3) = (char)pTVar19->op_assoc;
LAB_00134787:
      *(int *)(psVar45 + 2) = pTVar19->op_priority;
LAB_0013478d:
      *(int *)(psVar45 + 4) = pTVar19->term_priority;
LAB_00134793:
      *(int *)(psVar45 + 6) = iVar16;
      add_struct_ptr_member_fn(file,(void **)(psVar45 + 8),&spec_code_entry,"%s");
      pcVar52 = extraout_RDX_01;
    }
    end_struct_fn(file,0x18,pcVar52);
    g->write_line = g->write_line + 1;
    if (((g->terminals).v[uVar50]->field_0x2c & 0x10) != 0) {
      pcVar52 = make_name("d_tshift_%d_%s",uVar50 & 0xffffffff,tag);
      start_struct_fn(file,0x18,"D_Shift",pcVar52,"");
      if (file->binary == 0) {
        handle_comma(file);
        myfprintf(file->fp,"%d",(ulong)((g->productions).n + (g->terminals).v[uVar50]->index));
        if (file->binary != 0) {
          psVar45 = (short *)(file->tables).cur;
          goto LAB_00134870;
        }
        handle_comma(file);
        myfprintf(file->fp,"%d",3);
        if (file->binary != 0) {
          psVar45 = (short *)(file->tables).cur;
          goto LAB_00134874;
        }
        handle_comma(file);
        myfprintf(file->fp,"%d",(ulong)(g->terminals).v[uVar50]->op_assoc);
        if (file->binary != 0) {
          pTVar19 = (g->terminals).v[uVar50];
          psVar45 = (short *)(file->tables).cur;
          goto LAB_00134887;
        }
        handle_comma(file);
        myfprintf(file->fp,"%d",(ulong)(uint)(g->terminals).v[uVar50]->op_priority);
        if (file->binary != 0) {
          pTVar19 = (g->terminals).v[uVar50];
          psVar45 = (short *)(file->tables).cur;
          goto LAB_0013488d;
        }
        handle_comma(file);
        myfprintf(file->fp,"%d",(ulong)(uint)(g->terminals).v[uVar50]->term_priority);
        if (file->binary != 0) {
          psVar45 = (short *)(file->tables).cur;
          goto LAB_00134893;
        }
        handle_comma(file);
        myfprintf(file->fp,"%d",0);
        myfprintf(file->fp,", %s",final_code);
        pcVar52 = extraout_RDX_04;
      }
      else {
        psVar45 = (short *)(file->tables).cur;
        *psVar45 = (short)(g->productions).n + (short)(g->terminals).v[uVar50]->index;
LAB_00134870:
        *(undefined1 *)(psVar45 + 1) = 3;
LAB_00134874:
        pTVar19 = (g->terminals).v[uVar50];
        *(char *)((long)psVar45 + 3) = (char)pTVar19->op_assoc;
LAB_00134887:
        *(int *)(psVar45 + 2) = pTVar19->op_priority;
LAB_0013488d:
        *(int *)(psVar45 + 4) = pTVar19->term_priority;
LAB_00134893:
        *(int *)(psVar45 + 6) = iVar16;
        add_struct_ptr_member_fn(file,(void **)(psVar45 + 8),&spec_code_entry,"%s");
        pcVar52 = extraout_RDX_02;
      }
      end_struct_fn(file,0x18,pcVar52);
      g->write_line = g->write_line + 1;
    }
  }
  print(file,"\n");
  g->write_line = g->write_line + 1;
  uVar51 = (ulong)(g->states).n;
  uVar43 = 0;
  for (uVar50 = 0; uVar51 != uVar50; uVar50 = uVar50 + 1) {
    uVar43 = uVar43 + g->scanner_blocks * ((g->states).v[uVar50]->scanner).states.n;
  }
  pvVar20 = malloc((ulong)(uVar43 + (uVar43 == 0)) << 5);
  for (lVar39 = 8; lVar39 != 0xa8; lVar39 = lVar39 + 0x28) {
    pcVar52 = speculative_code + lVar39 + 0xf8;
    pcVar52[0] = '\0';
    pcVar52[1] = '\0';
    pcVar52[2] = '\0';
    pcVar52[3] = '\0';
    pcVar52 = pass_code + lVar39;
    pcVar52[0] = '\0';
    pcVar52[1] = '\0';
    pcVar52[2] = '\0';
    pcVar52[3] = '\0';
    pcVar52[4] = '\0';
    pcVar52[5] = '\0';
    pcVar52[6] = '\0';
    pcVar52[7] = '\0';
    pcVar52 = pass_code + lVar39 + 0xf8;
    pcVar52[0] = '\0';
    pcVar52[1] = '\0';
    pcVar52[2] = '\0';
    pcVar52[3] = '\0';
    pcVar52 = fname + lVar39;
    pcVar52[0] = '\0';
    pcVar52[1] = '\0';
    pcVar52[2] = '\0';
    pcVar52[3] = '\0';
    pcVar52[4] = '\0';
    pcVar52[5] = '\0';
    pcVar52[6] = '\0';
    pcVar52[7] = '\0';
  }
  scanner_block_fns.data[0] = (void *)(long)g->scanner_block_size;
  local_138[0] = '\0';
  local_138[1] = '\0';
  local_138[2] = '\0';
  local_138[3] = '\0';
  local_130 = (undefined1 *)0x0;
  local_574 = 1;
  uVar49 = 0;
  scanner_block_fns.data[1] = g;
  trans_scanner_block_fns.data[0] = scanner_block_fns.data[0];
  trans_scanner_block_fns.data[1] = g;
  for (uVar50 = 0; uVar50 < uVar51; uVar50 = uVar50 + 1) {
    pSVar7 = (g->states).v[uVar50];
    if (pSVar7->same_shifts == (State *)0x0) {
      for (uVar51 = 0; uVar41 = (pSVar7->scanner).transitions.n, uVar51 < uVar41;
          uVar51 = uVar51 + 1) {
        pSVar8 = (pSVar7->scanner).transitions.v[uVar51];
        pcVar52 = make_name("d_accepts_diff_%d_%d_%s",uVar50,uVar51,tag);
        start_array_fn(file,8,"","D_Shift *",pcVar52,"",0,"");
        for (uVar53 = 0; uVar53 < (pSVar8->accepts_diff).n; uVar53 = uVar53 + 1) {
          pAVar9 = (pSVar8->accepts_diff).v[uVar53];
          pcVar52 = "d_shift_%d_%s";
          if (pAVar9->kind == ACTION_SHIFT_TRAILING) {
            pcVar52 = "d_tshift_%d_%s";
          }
          pOVar37 = get_offset(file,pcVar52,(ulong)pAVar9->term->index);
          add_array_ptr_member_fn(file,pOVar37,"&%s%s",0);
        }
        if (file->binary == 0) {
          myfprintf(file->fp,"%d%s",0,"");
        }
        else {
          add_array_member_internal(file);
          pcVar52 = (file->tables).cur;
          pcVar52[0] = '\0';
          pcVar52[1] = '\0';
          pcVar52[2] = '\0';
          pcVar52[3] = '\0';
          pcVar52[4] = '\0';
          pcVar52[5] = '\0';
          pcVar52[6] = '\0';
          pcVar52[7] = '\0';
          ppcVar46 = &(file->tables).cur;
          *ppcVar46 = *ppcVar46 + file->elem_size;
        }
        end_array(file,"\n");
        g->write_line = g->write_line + 2;
      }
      if (uVar41 != 0) {
        pcVar52 = make_name("d_accepts_diff_%d_%s",uVar50,tag);
        start_array_fn(file,8,"","D_Shift **",pcVar52,"",0,"\n");
        uVar17 = (pSVar7->scanner).transitions.n;
        for (uVar41 = 0; uVar41 < uVar17; uVar41 = uVar41 + 1) {
          pOVar37 = get_offset(file,"d_accepts_diff_%d_%d_%s",uVar50,(ulong)uVar41,tag);
          add_array_ptr_member_fn
                    (file,pOVar37,"%s%s",(uint)(uVar41 == (pSVar7->scanner).transitions.n - 1));
          print(file,"\n");
          uVar17 = (pSVar7->scanner).transitions.n;
          if (uVar41 != uVar17 - 1) {
            g->write_line = g->write_line + 1;
          }
        }
        end_array(file,"\n\n");
        g->write_line = g->write_line + 3;
      }
      iVar16 = scanner_size(pSVar7);
      lVar39 = (ulong)(iVar16 - 1) * 0x28;
      for (uVar51 = 0; uVar51 < (pSVar7->scanner).states.n; uVar51 = uVar51 + 1) {
        if (pSVar7->same_shifts == (State *)0x0) {
          for (uVar41 = 0; (int)uVar41 < g->scanner_blocks; uVar41 = uVar41 + 1) {
            lVar54 = (ulong)uVar49 * 0x20;
            *(uint *)((long)pvVar20 + lVar54) = pSVar7->index;
            *(int *)((long)pvVar20 + lVar54 + 4) = (int)uVar51;
            *(uint *)((long)pvVar20 + lVar54 + 8) = uVar41;
            ppSVar10 = (pSVar7->scanner).states.v;
            lVar38 = (long)(int)uVar41 * (long)g->scanner_block_size;
            *(ScanState ***)((long)pvVar20 + lVar54 + 0x10) = ppSVar10[uVar51]->chars + lVar38;
            *(ScanStateTransition ***)((long)pvVar20 + lVar54 + 0x18) =
                 ppSVar10[uVar51]->transition + lVar38;
            uVar49 = uVar49 + 1;
            if (uVar43 < uVar49) {
              __assert_fail("ivsblock <= nvsblocks",
                            "/workspace/llm4binary/github/license_c_cmakelists/jplevyak[P]dparser/write_tables.c"
                            ,0x2b4,"void write_scanner_data(File *, Grammar *, char *)");
            }
            t = (void *)(lVar54 + (long)pvVar20);
            pvVar21 = set_add_fn(pass_code + lVar39,t,&scanner_block_fns);
            if (t == pvVar21) {
              iVar16 = scanner_size(pSVar7);
              pcVar52 = make_type(iVar16);
              pcVar22 = make_name("d_scanner_%d_%d_%d_%s",uVar50,uVar51 & 0xffffffff,(ulong)uVar41,
                                  tag);
              start_array_fn(file,iVar16,"",pcVar52,pcVar22,"SCANNER_BLOCK_SIZE",0x40,"\n");
              for (uVar55 = 0; iVar2 = g->scanner_block_size, (int)uVar55 < iVar2;
                  uVar55 = uVar55 + 1) {
                p_Var23 = get_copy_func(iVar16);
                pSVar11 = (pSVar7->scanner).states.v[uVar51]->chars[iVar2 * uVar41 + uVar55];
                if (pSVar11 == (ScanState *)0x0) {
                  pcVar52 = (char *)0x0;
                }
                else {
                  pcVar52 = (char *)(ulong)(pSVar11->index + 1);
                }
                add_array_member_fn(file,p_Var23,pcVar52,(uint)(uVar55 == g->scanner_block_size),
                                    (int)pcVar22);
                if ((~uVar55 & 0xf) == 0) {
                  print(file,"\n");
                  g->write_line = g->write_line + 1;
                }
              }
              end_array(file,"\n\n");
              g->write_line = g->write_line + 3;
            }
            if (((pSVar7->field_0x178 & 0x78) != 8) &&
               (pvVar21 = set_add_fn(fname + lVar39,t,&trans_scanner_block_fns), t == pvVar21)) {
              iVar16 = scanner_size(pSVar7);
              pcVar52 = make_type(iVar16);
              pcVar22 = make_name("d_accepts_diff_%d_%d_%d_%s",uVar50,uVar51 & 0xffffffff,
                                  (ulong)uVar41,tag);
              start_array_fn(file,iVar16,"",pcVar52,pcVar22,"SCANNER_BLOCK_SIZE",0x40,"\n");
              for (uVar55 = 0; iVar2 = g->scanner_block_size, (int)uVar55 < iVar2;
                  uVar55 = uVar55 + 1) {
                p_Var23 = get_copy_func(iVar16);
                add_array_member_fn(file,p_Var23,
                                    (char *)(ulong)(pSVar7->scanner).states.v[uVar51]->transition
                                                   [iVar2 * uVar41 + uVar55]->index,
                                    (uint)(uVar55 == g->scanner_block_size),(int)pcVar22);
                if ((~uVar55 & 0xf) == 0) {
                  print(file,"\n");
                  g->write_line = g->write_line + 1;
                }
              }
              end_array(file,"\n\n");
              g->write_line = g->write_line + 3;
            }
          }
          if (((pSVar7->scanner).states.v[uVar51]->accepts).n != 0) {
            snprintf(speculative_code,0xff,"d_shift_%d_%d_%s",uVar50,uVar51 & 0xffffffff,tag);
            uVar53 = 0;
            while( true ) {
              pSVar11 = (pSVar7->scanner).states.v[uVar51];
              uVar41 = (pSVar11->accepts).n;
              if (uVar41 <= uVar53) break;
              pAVar9 = (pSVar11->accepts).v[uVar53];
              if (uVar41 == 1) {
                if (pAVar9->temp_string == (char *)0x0) {
                  pcVar52 = dup_str(speculative_code,(char *)0x0);
                  pAVar9->temp_string = pcVar52;
                  pAVar24 = (Action *)set_add_fn(local_138,pAVar9,&shift_fns);
                  if (pAVar24 == pAVar9) goto LAB_0013527c;
                }
              }
              else {
LAB_0013527c:
                if (uVar53 == 0) {
                  pcVar52 = make_name(speculative_code);
                  start_array_fn(file,8,"","D_Shift *",pcVar52,"",0,"");
                }
                if (pAVar9->kind == ACTION_SHIFT_TRAILING) {
                  pcVar52 = "d_tshift_%d_%s";
                }
                else {
                  pcVar52 = "d_shift_%d_%s";
                }
                pOVar37 = get_offset(file,pcVar52,(ulong)pAVar9->term->index);
                add_array_ptr_member_fn(file,pOVar37,"&%s%s",0);
                uVar33 = (ulong)(((pSVar7->scanner).states.v[uVar51]->accepts).n - 1);
                if (uVar53 == uVar33) {
                  add_array_ptr_member_fn(file,&null_entry,"&%s%s",1);
                  end_array(file,"\n\n");
                  uVar33 = (ulong)(((pSVar7->scanner).states.v[uVar51]->accepts).n - 1);
                }
                if (uVar53 == uVar33) {
                  g->write_line = g->write_line + 2;
                }
              }
              uVar53 = uVar53 + 1;
            }
          }
        }
      }
      uVar51 = (ulong)(g->states).n;
    }
  }
  for (uVar50 = 0; uVar50 < uVar51; uVar50 = uVar50 + 1) {
    pSVar7 = (g->states).v[uVar50];
    if (((pSVar7->scanner).states.n != 0) && (pSVar7->same_shifts == (State *)0x0)) {
      pcVar52 = scanner_u_type(pSVar7);
      pcVar22 = make_name("d_scanner_%d_%s",uVar50 & 0xffffffff,tag);
      start_array_fn(file,0x28,"SB_",pcVar52,pcVar22,"",(pSVar7->scanner).states.n,"\n");
      g->write_line = g->write_line + 1;
      iVar16 = scanner_size(pSVar7);
      for (uVar51 = 0; uVar51 < (pSVar7->scanner).states.n; uVar51 = uVar51 + 1) {
        start_struct_in_array(file);
        pSVar11 = (pSVar7->scanner).states.v[uVar51];
        uVar17 = (pSVar11->accepts).n;
        if (uVar17 == 0) {
          if (file != (File *)0x0) {
            ppvVar44 = (void **)(file->tables).cur;
            if (ppvVar44 == (void **)0x0) {
              ppvVar44 = (void **)0x0;
            }
            pOVar37 = &null_entry;
            goto LAB_0013554b;
          }
        }
        else if (uVar17 == 1) {
          pvVar21 = set_add_fn(local_138,*(pSVar11->accepts).v,&shift_fns);
          if (file != (File *)0x0) {
            ppvVar44 = (void **)(file->tables).cur;
            pOVar37 = get_offset(file,"%s",*(undefined8 *)((long)pvVar21 + 0x28));
            if (ppvVar44 == (void **)0x0) {
              ppvVar44 = (void **)0x0;
            }
LAB_0013554b:
            add_struct_ptr_member_fn(file,ppvVar44,pOVar37,"%s");
          }
        }
        else if (file != (File *)0x0) {
          ppvVar44 = (void **)(file->tables).cur;
          pOVar37 = get_offset(file,"d_shift_%d_%d_%s",uVar50,uVar51 & 0xffffffff,tag);
          if (ppvVar44 == (void **)0x0) {
            ppvVar44 = (void **)0x0;
          }
          goto LAB_0013554b;
        }
        print_no_comma(file,", {");
        lVar39 = 8;
        for (uVar53 = 0; (long)uVar53 < (long)g->scanner_blocks; uVar53 = uVar53 + 1) {
          speculative_code._0_4_ = pSVar7->index;
          speculative_code._8_4_ = (undefined4)uVar53;
          ppSVar10 = (pSVar7->scanner).states.v;
          lVar38 = (long)(int)speculative_code._8_4_ * (long)g->scanner_block_size;
          speculative_code._16_8_ = ppSVar10[uVar51]->chars + lVar38;
          speculative_code._24_8_ = ppSVar10[uVar51]->transition + lVar38;
          speculative_code._4_4_ = (int)uVar51;
          puVar25 = (uint *)set_add_fn(pass_code + (ulong)(iVar16 - 1) * 0x28,speculative_code,
                                       &scanner_block_fns);
          if (puVar25 == (uint *)speculative_code) {
            __assert_fail("yv != xv",
                          "/workspace/llm4binary/github/license_c_cmakelists/jplevyak[P]dparser/write_tables.c"
                          ,0x321,"void write_scanner_data(File *, Grammar *, char *)");
          }
          if (file != (File *)0x0) {
            pcVar52 = (file->tables).cur;
            if (pcVar52 == (char *)0x0) {
              pOVar37 = get_offset(file,"d_scanner_%d_%d_%d_%s",(ulong)*puVar25,(ulong)puVar25[1],
                                   (ulong)puVar25[2],tag);
              ppvVar44 = (void **)0x0;
            }
            else {
              ppvVar44 = (void **)(pcVar52 + lVar39);
              pOVar37 = get_offset(file,"d_scanner_%d_%d_%d_%s",(ulong)*puVar25,(ulong)puVar25[1],
                                   (ulong)puVar25[2],tag);
            }
            add_struct_ptr_member_fn(file,ppvVar44,pOVar37,"%s");
          }
          if (((uVar53 & 1) != 0) && (uVar53 != g->scanner_blocks - 1)) {
            print(file,"\n ");
            g->write_line = g->write_line + 1;
          }
          lVar39 = lVar39 + 8;
        }
        print(file,"}");
        pcVar52 = ",\n";
        if (uVar51 == (pSVar7->scanner).states.n - 1) {
          pcVar52 = "\n";
        }
        end_struct_in_array(file,pcVar52);
        g->write_line = g->write_line + 1;
      }
      end_array(file,"\n\n");
      g->write_line = g->write_line + 2;
      if ((pSVar7->field_0x178 & 0x78) != 8) {
        pcVar52 = scanner_u_type(pSVar7);
        pcVar22 = make_name("d_transition_%d_%s",uVar50 & 0xffffffff,tag);
        start_array_fn(file,0x20,"SB_trans_",pcVar52,pcVar22,"",(pSVar7->scanner).states.n,"\n");
        g->write_line = g->write_line + 1;
        iVar16 = scanner_size(pSVar7);
        for (uVar51 = 0; uVar51 < (pSVar7->scanner).states.n; uVar51 = uVar51 + 1) {
          start_struct_in_array(file);
          print(file,"{");
          lVar39 = 0;
          for (uVar53 = 0; (long)uVar53 < (long)g->scanner_blocks; uVar53 = uVar53 + 1) {
            speculative_code._0_4_ = pSVar7->index;
            speculative_code._4_4_ = (undefined4)uVar51;
            speculative_code._8_4_ = (undefined4)uVar53;
            ppSVar10 = (pSVar7->scanner).states.v;
            lVar38 = (long)(int)speculative_code._8_4_ * (long)g->scanner_block_size;
            speculative_code._16_8_ = ppSVar10[uVar51]->chars + lVar38;
            speculative_code._24_8_ = ppSVar10[uVar51]->transition + lVar38;
            puVar25 = (uint *)set_add_fn(fname + (ulong)(iVar16 - 1) * 0x28,speculative_code,
                                         &trans_scanner_block_fns);
            if (puVar25 == (uint *)speculative_code) {
              __assert_fail("yv != xv",
                            "/workspace/llm4binary/github/license_c_cmakelists/jplevyak[P]dparser/write_tables.c"
                            ,0x345,"void write_scanner_data(File *, Grammar *, char *)");
            }
            if (file != (File *)0x0) {
              pcVar52 = (file->tables).cur;
              if (pcVar52 == (char *)0x0) {
                pOVar37 = get_offset(file,"d_accepts_diff_%d_%d_%d_%s",(ulong)*puVar25,
                                     (ulong)puVar25[1],(ulong)puVar25[2],tag);
                ppvVar44 = (void **)0x0;
              }
              else {
                ppvVar44 = (void **)(pcVar52 + lVar39);
                pOVar37 = get_offset(file,"d_accepts_diff_%d_%d_%d_%s",(ulong)*puVar25,
                                     (ulong)puVar25[1],(ulong)puVar25[2],tag);
              }
              add_struct_ptr_member_fn(file,ppvVar44,pOVar37,"%s");
            }
            if (((uVar53 & 1) != 0) && (uVar53 != g->scanner_blocks - 1)) {
              print(file,"\n ");
              g->write_line = g->write_line + 1;
            }
            lVar39 = lVar39 + 8;
          }
          print(file,"}");
          pcVar52 = ",\n";
          if (uVar51 == (pSVar7->scanner).states.n - 1) {
            pcVar52 = "\n";
          }
          end_struct_in_array(file,pcVar52);
          g->write_line = g->write_line + 1;
        }
        end_array(file,"\n\n");
        g->write_line = g->write_line + 2;
      }
    }
    uVar51 = (ulong)(g->states).n;
  }
  pcVar52 = fname + 0x10;
  lVar39 = 4;
  pcVar22 = pass_code + 0x10;
  while (bVar56 = lVar39 != 0, lVar39 = lVar39 + -1, bVar56) {
    pcVar28 = *(char **)(pcVar22 + -8);
    if (pcVar22 != pcVar28 && pcVar28 != (char *)0x0) {
      free(pcVar28);
    }
    pcVar22[-0x10] = '\0';
    pcVar22[-0xf] = '\0';
    pcVar22[-0xe] = '\0';
    pcVar22[-0xd] = '\0';
    pcVar22[-8] = '\0';
    pcVar22[-7] = '\0';
    pcVar22[-6] = '\0';
    pcVar22[-5] = '\0';
    pcVar22[-4] = '\0';
    pcVar22[-3] = '\0';
    pcVar22[-2] = '\0';
    pcVar22[-1] = '\0';
    pcVar28 = *(char **)(pcVar52 + -8);
    if (pcVar52 != pcVar28 && pcVar28 != (char *)0x0) {
      free(pcVar28);
    }
    pcVar52[-0x10] = '\0';
    pcVar52[-0xf] = '\0';
    pcVar52[-0xe] = '\0';
    pcVar52[-0xd] = '\0';
    pcVar52[-8] = '\0';
    pcVar52[-7] = '\0';
    pcVar52[-6] = '\0';
    pcVar52[-5] = '\0';
    pcVar52[-4] = '\0';
    pcVar52[-3] = '\0';
    pcVar52[-2] = '\0';
    pcVar52[-1] = '\0';
    pcVar52 = pcVar52 + 0x28;
    pcVar22 = pcVar22 + 0x28;
  }
  if (local_130 != local_128 && local_130 != (undefined1 *)0x0) {
    free(local_130);
  }
  free(pvVar20);
  if (file->binary == 0) {
    pFVar30 = (FILE *)file->fp;
    for (uVar50 = 0; uVar50 < (g->states).n; uVar50 = uVar50 + 1) {
      pSVar7 = (g->states).v[uVar50];
      for (uVar51 = 0; uVar51 < (pSVar7->shift_actions).n; uVar51 = uVar51 + 1) {
        pAVar9 = (pSVar7->shift_actions).v[uVar51];
        if ((pAVar9->kind == ACTION_SHIFT) && (pAVar9->term->kind == TERM_CODE)) {
          if ((pSVar7->field_0x178 & 2) == 0) {
            pSVar7->field_0x178 = pSVar7->field_0x178 | 2;
            pcVar52 = make_name("d_scan_code_%d_%s",uVar50 & 0xffffffff,tag);
            new_offset(file,pcVar52);
            myfprintf((FILE *)pFVar30,
                      "int d_scan_code_%d_%s(d_loc_t *loc,unsigned short *symbol, int *term_priority,unsigned char *op_assoc, int *op_priority) {\n  int res;\n"
                      ,uVar50 & 0xffffffff,tag);
            g->write_line = g->write_line + 1;
          }
          myfprintf((FILE *)pFVar30,"  if ((res = ");
          pcVar52 = pAVar9->term->string;
          sVar29 = strlen(pcVar52);
          uVar53 = (ulong)((int)sVar29 - 1);
          if (pcVar52[uVar53] == ')') {
            fwrite(pcVar52,uVar53,1,pFVar30);
            myfprintf((FILE *)pFVar30,", ");
          }
          else {
            myfprintf((FILE *)pFVar30,"%s(",pcVar52);
          }
          myfprintf((FILE *)pFVar30,
                    "loc, op_assoc, op_priority))) {\n    *symbol = %d;\n    *term_priority = %d;\n    return res;\n  }\n"
                    ,(ulong)((g->productions).n + pAVar9->term->index),
                    (ulong)(uint)pAVar9->term->term_priority);
          g->write_line = g->write_line + 1;
        }
      }
      if ((pSVar7->field_0x178 & 2) != 0) {
        myfprintf((FILE *)pFVar30,"  return 0;\n}\n\n");
        g->write_line = g->write_line + 3;
      }
    }
  }
  uVar43 = (g->productions).n + (g->terminals).n + 7 >> 3;
  uVar50 = (ulong)uVar43;
  pvVar20 = malloc(uVar50);
  pcVar52 = final_code + 0x10;
  final_code[0] = '\0';
  final_code[1] = '\0';
  final_code[2] = '\0';
  final_code[3] = '\0';
  final_code[8] = '\0';
  final_code[9] = '\0';
  final_code[10] = '\0';
  final_code[0xb] = '\0';
  final_code[0xc] = '\0';
  final_code[0xd] = '\0';
  final_code[0xe] = '\0';
  final_code[0xf] = '\0';
  for (uVar51 = 0; uVar36 = final_code._0_4_, uVar51 < (g->states).n; uVar51 = uVar51 + 1) {
    pSVar7 = (g->states).v[uVar51];
    uVar53 = (ulong)(pSVar7->gotos).n;
    if (uVar53 != 0) {
      for (uVar33 = 0; uVar53 != uVar33; uVar33 = uVar33 + 1) {
        pEVar12 = (pSVar7->gotos).v[uVar33]->elem;
        if ((pEVar12->kind == ELEM_TERM) && (((pEVar12->e).term)->kind == TERM_TOKEN)) {
          pSVar7->field_0x178 = pSVar7->field_0x178 | 4;
        }
      }
      memset(pvVar20,0,uVar50);
      uVar49 = elem_symbol(g,(*(pSVar7->gotos).v)->elem);
      pbVar1 = (byte *)((long)pvVar20 + (ulong)(uVar49 >> 3));
      *pbVar1 = *pbVar1 | (byte)(1 << ((byte)uVar49 & 7));
      for (uVar53 = 1; uVar53 < (pSVar7->gotos).n; uVar53 = uVar53 + 1) {
        uVar17 = elem_symbol(g,(pSVar7->gotos).v[uVar53]->elem);
        pbVar1 = (byte *)((long)pvVar20 + (ulong)(uVar17 >> 3));
        *pbVar1 = *pbVar1 | (byte)(1 << ((byte)uVar17 & 7));
        if (uVar17 < uVar49) {
          uVar49 = uVar17;
        }
      }
      do {
        lVar39 = 0;
LAB_00135b57:
        if ((int)(pSVar7->gotos).n <= lVar39) {
          pSVar7->goto_table_offset = uVar49;
          pcVar22 = make_name("d_goto_valid_%d_%s",uVar51,tag);
          start_array_fn(file,1,"","unsigned char",pcVar22,"",0,"");
          print(file,"\n");
          g->write_line = g->write_line + 1;
          for (uVar53 = 0; uVar50 != uVar53; uVar53 = uVar53 + 1) {
            if (file->binary == 0) {
              pcVar22 = ",";
              if (uVar43 - 1 == uVar53) {
                pcVar22 = "";
              }
              myfprintf(file->fp,"0x%x%s",(ulong)*(byte *)((long)pvVar20 + uVar53),pcVar22);
            }
            else {
              add_array_member_internal(file);
              *(file->tables).cur = *(char *)((long)pvVar20 + uVar53);
              ppcVar46 = &(file->tables).cur;
              *ppcVar46 = *ppcVar46 + file->elem_size;
            }
          }
          end_array(file,"\n");
          g->write_line = g->write_line + 1;
          goto LAB_00135d38;
        }
        uVar17 = elem_symbol(g,(pSVar7->gotos).v[lVar39]->elem);
        uVar41 = uVar17 - uVar49;
        while (uVar53 = (ulong)(uint)final_code._0_4_, (uint)final_code._0_4_ <= uVar41) {
          if (final_code._8_8_ == 0) {
            final_code._0_4_ = final_code._0_4_ + 1;
            pcVar22 = final_code + uVar53 * 8 + 0x10;
            pcVar22[0] = '\0';
            pcVar22[1] = '\0';
            pcVar22[2] = '\0';
            pcVar22[3] = '\0';
            pcVar22[4] = '\0';
            pcVar22[5] = '\0';
            pcVar22[6] = '\0';
            pcVar22[7] = '\0';
            final_code._8_8_ = pcVar52;
          }
          else if ((char *)final_code._8_8_ == pcVar52) {
            if (2 < (uint)final_code._0_4_) goto LAB_00135bd3;
LAB_00135ba0:
            final_code._0_4_ = final_code._0_4_ + 1;
            *(undefined8 *)(final_code._8_8_ + uVar53 * 8) = 0;
          }
          else {
            if ((final_code._0_4_ & 7) != 0) goto LAB_00135ba0;
LAB_00135bd3:
            vec_add_internal(final_code,(void *)0x0);
          }
        }
        if (*(long *)(final_code._8_8_ + (ulong)uVar41 * 8) == 0) goto code_r0x00135be8;
        for (; 0 < lVar39; lVar39 = lVar39 + -1) {
          uVar17 = elem_symbol(g,(pSVar7->gotos).v[lVar39 + -1]->elem);
          *(undefined8 *)(final_code._8_8_ + (ulong)(uVar17 - uVar49) * 8) = 0;
        }
        uVar49 = uVar49 - 1;
      } while( true );
    }
    pSVar7->goto_table_offset = -0x7fffffff;
LAB_00135d38:
    if ((pSVar7->reduce_actions).n != 0) {
      pcVar22 = make_name("d_reductions_%d_%s",uVar51,tag);
      start_array_fn(file,8,"","D_Reduction *",pcVar22,"",0,"");
      for (uVar53 = 0; uVar53 < (pSVar7->reduce_actions).n; uVar53 = uVar53 + 1) {
        pRVar35 = (pSVar7->reduce_actions).v[uVar53]->rule;
        pRVar34 = pRVar35->same_reduction;
        if (pRVar34 == (Rule *)0x0) {
          pRVar34 = pRVar35;
        }
        pOVar37 = get_offset(file,"d_reduction_%d_%s",(ulong)pRVar34->index,tag);
        add_array_ptr_member_fn
                  (file,pOVar37,"&%s%s",(uint)(uVar53 == (pSVar7->reduce_actions).n - 1));
      }
      end_array(file,"\n");
      g->write_line = g->write_line + 1;
    }
    if ((pSVar7->right_epsilon_hints).n != 0) {
      pcVar22 = make_name("d_right_epsilon_hints_%d_%s",uVar51,tag);
      start_array_fn(file,0x10,"","D_RightEpsilonHint",pcVar22,"",0,"");
      for (uVar53 = 0; uVar53 < (pSVar7->right_epsilon_hints).n; uVar53 = uVar53 + 1) {
        start_struct_in_array(file);
        if (file->binary == 0) {
          handle_comma(file);
          myfprintf(file->fp,"%d",(ulong)(pSVar7->right_epsilon_hints).v[uVar53]->depth);
          if (file->binary != 0) {
            pHVar27 = (pSVar7->right_epsilon_hints).v[uVar53];
            pcVar22 = (file->tables).cur;
            goto LAB_00135ee2;
          }
          handle_comma(file);
          myfprintf(file->fp,"%d",(ulong)(pSVar7->right_epsilon_hints).v[uVar53]->state->index);
          pcVar22 = (file->tables).cur;
          pHVar27 = (pSVar7->right_epsilon_hints).v[uVar53];
          if (pcVar22 != (char *)0x0) goto LAB_00135eed;
          pRVar35 = pHVar27->rule->same_reduction;
          if (pRVar35 == (Rule *)0x0) {
            pRVar35 = pHVar27->rule;
          }
          pOVar37 = get_offset(file,"d_reduction_%d_%s",(ulong)pRVar35->index,tag);
          ppvVar44 = (void **)0x0;
        }
        else {
          pHVar27 = (pSVar7->right_epsilon_hints).v[uVar53];
          pcVar22 = (file->tables).cur;
          *(short *)pcVar22 = (short)pHVar27->depth;
LAB_00135ee2:
          *(short *)(pcVar22 + 2) = (short)pHVar27->state->index;
LAB_00135eed:
          ppvVar44 = (void **)(pcVar22 + 8);
          pRVar35 = pHVar27->rule->same_reduction;
          if (pRVar35 == (Rule *)0x0) {
            pRVar35 = pHVar27->rule;
          }
          pOVar37 = get_offset(file,"d_reduction_%d_%s",(ulong)pRVar35->index,tag);
        }
        add_struct_ptr_member_fn(file,ppvVar44,pOVar37,"&%s");
        pcVar22 = ",";
        if (uVar53 == (pSVar7->right_epsilon_hints).n - 1) {
          pcVar22 = "";
        }
        end_struct_in_array(file,pcVar22);
      }
      end_array(file,"\n");
      g->write_line = g->write_line + 1;
    }
  }
  pcVar22 = make_name("d_gotos_%s",tag);
  if (uVar36 == 0) {
    start_array_fn(file,2,"","unsigned short",pcVar22,"",1,"");
    if (file->binary == 0) {
      myfprintf(file->fp,"%d%s",0,"");
    }
    else {
      add_array_member_internal(file);
      pcVar22 = (file->tables).cur;
      pcVar22[0] = '\0';
      pcVar22[1] = '\0';
      (file->tables).cur = pcVar22 + file->elem_size;
    }
    pcVar22 = "\n";
  }
  else {
    local_574 = 2;
    start_array_fn(file,2,"","unsigned short",pcVar22,"",final_code._0_4_,"\n");
    g->write_line = g->write_line + 1;
    for (uVar50 = 0; uVar50 < (uint)final_code._0_4_; uVar50 = uVar50 + 1) {
      if (0xffff < *(ulong *)(final_code._8_8_ + uVar50 * 8)) {
        d_fail("goto table overflow");
      }
      if (file->binary == 0) {
        pcVar22 = ",";
        if (uVar50 == final_code._0_4_ - 1) {
          pcVar22 = "";
        }
        myfprintf(file->fp,"%d%s",*(undefined8 *)(final_code._8_8_ + uVar50 * 8),pcVar22);
      }
      else {
        add_array_member_internal(file);
        pcVar22 = (file->tables).cur;
        *(undefined2 *)pcVar22 = *(undefined2 *)(final_code._8_8_ + uVar50 * 8);
        (file->tables).cur = pcVar22 + file->elem_size;
      }
      if ((~(uint)uVar50 & 0xf) == 0) {
        print(file,"\n");
        g->write_line = g->write_line + 1;
      }
    }
    pcVar22 = "\n\n";
  }
  end_array(file,pcVar22);
  g->write_line = g->write_line + local_574;
  if ((char *)final_code._8_8_ != pcVar52 && final_code._8_8_ != 0) {
    free((void *)final_code._8_8_);
  }
  free(pvVar20);
  uVar43 = (g->states).n;
  if (uVar43 != 0) {
    for (uVar50 = 0; uVar50 < uVar43; uVar50 = uVar50 + 1) {
      pSVar7 = (g->states).v[uVar50];
      if (((pSVar7->error_recovery_hints).n != 0) &&
         (pSVar26 = (State *)set_add_fn(&er_hash,pSVar7,&er_hint_hash_fns), pSVar26 == pSVar7)) {
        pcVar52 = make_name("d_error_recovery_hints_%d_%s",uVar50 & 0xffffffff,tag);
        pcVar22 = "";
        start_array_fn(file,0x10,"","D_ErrorRecoveryHint",pcVar52,"",0,"");
        if (1 < (pSVar7->error_recovery_hints).n) {
          pcVar22 = "\n";
        }
        print(file,pcVar22);
        for (uVar51 = 0; uVar51 < (pSVar7->error_recovery_hints).n; uVar51 = uVar51 + 1) {
          pRVar35 = (pSVar7->error_recovery_hints).v[uVar51]->rule;
          pcVar52 = escape_string((((pRVar35->elems).v[(pRVar35->elems).n - 1]->e).term)->string);
          start_struct_in_array(file);
          if (file->binary == 0) {
            handle_comma(file);
            myfprintf(file->fp,"%d",(ulong)(pSVar7->error_recovery_hints).v[uVar51]->depth);
            if (file->binary != 0) {
              pHVar27 = (pSVar7->error_recovery_hints).v[uVar51];
              pcVar22 = (file->tables).cur;
              goto LAB_001364cf;
            }
            handle_comma(file);
            myfprintf(file->fp,"%d",
                      (ulong)(pSVar7->error_recovery_hints).v[uVar51]->rule->prod->index);
            pcVar22 = (file->tables).cur;
            if (pcVar22 != (char *)0x0) goto LAB_001364df;
            ppcVar46 = (char **)0x0;
          }
          else {
            pHVar27 = (pSVar7->error_recovery_hints).v[uVar51];
            pcVar22 = (file->tables).cur;
            *(short *)pcVar22 = (short)pHVar27->depth;
LAB_001364cf:
            *(short *)(pcVar22 + 2) = (short)pHVar27->rule->prod->index;
LAB_001364df:
            ppcVar46 = (char **)(pcVar22 + 8);
          }
          add_struct_str_member_fn(file,ppcVar46,pcVar52);
          pcVar22 = ",\n";
          if (uVar51 == (pSVar7->error_recovery_hints).n - 1) {
            pcVar22 = "";
          }
          end_struct_in_array(file,pcVar22);
          if (uVar51 != (pSVar7->error_recovery_hints).n - 1) {
            g->write_line = g->write_line + 1;
          }
          free(pcVar52);
        }
        end_array(file,"\n");
        g->write_line = g->write_line + 1;
      }
      uVar43 = (g->states).n;
    }
  }
  print(file,"\n");
  pcVar52 = make_name("d_states_%s",tag);
  start_array_fn(file,0x78,"","D_State",pcVar52,"",0,"");
  if ((g->states).n == 0) {
    if (file->binary == 0) {
      myfprintf(file->fp,"{{0, {0, NULL}, 0, NULL}};\n\n");
    }
    else {
      d_fail("no states\n");
    }
  }
  else {
    print(file,"\n");
    for (uVar50 = 0; uVar50 < (g->states).n; uVar50 = uVar50 + 1) {
      pSVar7 = (g->states).v[uVar50];
      pSVar26 = pSVar7->same_shifts;
      if (pSVar7->same_shifts == (State *)0x0) {
        pSVar26 = pSVar7;
      }
      start_struct_in_array(file);
      if ((pSVar7->gotos).n == 0) {
        if (file != (File *)0x0) {
          ppvVar44 = (void **)(file->tables).cur;
          if (ppvVar44 == (void **)0x0) {
            ppvVar44 = (void **)0x0;
          }
          pOVar37 = &null_entry;
          goto LAB_001366b4;
        }
      }
      else if (file != (File *)0x0) {
        ppvVar44 = (void **)(file->tables).cur;
        pOVar37 = get_offset(file,"d_goto_valid_%d_%s",uVar50 & 0xffffffff,tag);
        if (ppvVar44 == (void **)0x0) {
          ppvVar44 = (void **)0x0;
        }
LAB_001366b4:
        add_struct_ptr_member_fn(file,ppvVar44,pOVar37,"%s");
      }
      if (file->binary == 0) {
        handle_comma(file);
        myfprintf(file->fp,"%d",(ulong)(uint)pSVar7->goto_table_offset);
      }
      else {
        *(int *)((file->tables).cur + 8) = pSVar7->goto_table_offset;
      }
      print_no_comma(file,", {");
      uVar17 = (pSVar7->reduce_actions).n;
      if (uVar17 == 0) {
        if (file->binary == 0) {
          handle_comma(file);
          myfprintf(file->fp,"%d",0);
          pcVar52 = (file->tables).cur;
          if (pcVar52 != (char *)0x0) goto LAB_001367c5;
          ppvVar44 = (void **)0x0;
        }
        else {
          pcVar52 = (file->tables).cur;
          pcVar52[0x10] = '\0';
          pcVar52[0x11] = '\0';
          pcVar52[0x12] = '\0';
          pcVar52[0x13] = '\0';
LAB_001367c5:
          ppvVar44 = (void **)(pcVar52 + 0x18);
        }
        pOVar37 = &null_entry;
      }
      else {
        if (file->binary == 0) {
          handle_comma(file);
          myfprintf(file->fp,"%d",(ulong)(pSVar7->reduce_actions).n);
          pcVar52 = (file->tables).cur;
          if (pcVar52 == (char *)0x0) {
            pOVar37 = get_offset(file,"d_reductions_%d_%s",uVar50 & 0xffffffff,tag);
            ppvVar44 = (void **)0x0;
            goto LAB_001367cf;
          }
        }
        else {
          pcVar52 = (file->tables).cur;
          *(uint *)(pcVar52 + 0x10) = uVar17;
        }
        ppvVar44 = (void **)(pcVar52 + 0x18);
        pOVar37 = get_offset(file,"d_reductions_%d_%s",uVar50 & 0xffffffff,tag);
      }
LAB_001367cf:
      add_struct_ptr_member_fn(file,ppvVar44,pOVar37,"%s");
      print(file,"}, ");
      print_no_comma(file,"{");
      uVar17 = (pSVar7->right_epsilon_hints).n;
      if (uVar17 == 0) {
        if (file->binary == 0) {
          handle_comma(file);
          myfprintf(file->fp,"%d",0);
          pcVar52 = (file->tables).cur;
          if (pcVar52 != (char *)0x0) goto LAB_001368b8;
          ppvVar44 = (void **)0x0;
        }
        else {
          pcVar52 = (file->tables).cur;
          pcVar52[0x20] = '\0';
          pcVar52[0x21] = '\0';
          pcVar52[0x22] = '\0';
          pcVar52[0x23] = '\0';
LAB_001368b8:
          ppvVar44 = (void **)(pcVar52 + 0x28);
        }
        pOVar37 = &null_entry;
      }
      else {
        if (file->binary == 0) {
          handle_comma(file);
          myfprintf(file->fp,"%d",(ulong)(pSVar7->right_epsilon_hints).n);
          pcVar52 = (file->tables).cur;
          if (pcVar52 == (char *)0x0) {
            pOVar37 = get_offset(file,"d_right_epsilon_hints_%d_%s",uVar50 & 0xffffffff,tag);
            ppvVar44 = (void **)0x0;
            goto LAB_001368c2;
          }
        }
        else {
          pcVar52 = (file->tables).cur;
          *(uint *)(pcVar52 + 0x20) = uVar17;
        }
        ppvVar44 = (void **)(pcVar52 + 0x28);
        pOVar37 = get_offset(file,"d_right_epsilon_hints_%d_%s",uVar50 & 0xffffffff,tag);
      }
LAB_001368c2:
      add_struct_ptr_member_fn(file,ppvVar44,pOVar37,"%s");
      print(file,"}, ");
      print_no_comma(file,"{");
      if ((pSVar7->error_recovery_hints).n == 0) {
        if (file->binary == 0) {
          handle_comma(file);
          myfprintf(file->fp,"%d",0);
          pcVar52 = (file->tables).cur;
          if (pcVar52 != (char *)0x0) goto LAB_001369c8;
          ppvVar44 = (void **)0x0;
        }
        else {
          pcVar52 = (file->tables).cur;
          pcVar52[0x30] = '\0';
          pcVar52[0x31] = '\0';
          pcVar52[0x32] = '\0';
          pcVar52[0x33] = '\0';
LAB_001369c8:
          ppvVar44 = (void **)(pcVar52 + 0x38);
        }
        add_struct_ptr_member_fn(file,ppvVar44,&null_entry,"%s");
      }
      else {
        puVar25 = (uint *)set_add_fn(&er_hash,pSVar7,&er_hint_hash_fns);
        if (file->binary == 0) {
          handle_comma(file);
          myfprintf(file->fp,"%d",(ulong)(pSVar7->error_recovery_hints).n);
          pcVar52 = (file->tables).cur;
          if (pcVar52 != (char *)0x0) goto LAB_00136965;
          pOVar37 = get_offset(file,"d_error_recovery_hints_%d_%s",(ulong)*puVar25,tag);
          ppvVar44 = (void **)0x0;
        }
        else {
          pcVar52 = (file->tables).cur;
          *(uint *)(pcVar52 + 0x30) = (pSVar7->error_recovery_hints).n;
LAB_00136965:
          ppvVar44 = (void **)(pcVar52 + 0x38);
          pOVar37 = get_offset(file,"d_error_recovery_hints_%d_%s",(ulong)*puVar25,tag);
        }
        add_struct_ptr_member_fn(file,ppvVar44,pOVar37,"%s");
      }
      print(file,"}");
      if ((((pSVar7->shift_actions).n == 0) && ((pSVar7->field_0x178 & 2) == 0)) &&
         (((pSVar7->field_0x178 & 4) == 0 || ((g->scanner).code == (char *)0x0)))) {
        if (file->binary == 0) {
          handle_comma(file);
          pFVar48 = file->fp;
          uVar40 = 0;
LAB_00136a4a:
          myfprintf(pFVar48,"%d",uVar40);
        }
        else {
          pcVar52 = (file->tables).cur;
          pcVar52[0x40] = '\0';
          pcVar52[0x41] = '\0';
          pcVar52[0x42] = '\0';
          pcVar52[0x43] = '\0';
        }
      }
      else {
        if (file->binary == 0) {
          handle_comma(file);
          pFVar48 = file->fp;
          uVar40 = 1;
          goto LAB_00136a4a;
        }
        pcVar52 = (file->tables).cur;
        pcVar52[0x40] = '\x01';
        pcVar52[0x41] = '\0';
        pcVar52[0x42] = '\0';
        pcVar52[0x43] = '\0';
      }
      if ((g->scanner).code == (char *)0x0) {
        pcVar52 = (file->tables).cur;
        if ((pSVar7->field_0x178 & 2) == 0) {
          if (pcVar52 == (char *)0x0) goto LAB_00136b8d;
          ppvVar44 = (void **)(pcVar52 + 0x48);
          goto LAB_00136b8f;
        }
        if (pcVar52 == (char *)0x0) {
          pOVar37 = get_offset(file,"d_scan_code_%d_%s",uVar50 & 0xffffffff,tag);
          ppvVar44 = (void **)0x0;
        }
        else {
          ppvVar44 = (void **)(pcVar52 + 0x48);
          pOVar37 = get_offset(file,"d_scan_code_%d_%s",uVar50 & 0xffffffff,tag);
        }
LAB_00136bba:
        add_struct_ptr_member_fn(file,ppvVar44,pOVar37,"%s");
      }
      else {
        if ((pSVar7->field_0x178 & 4) == 0) {
          pcVar52 = (file->tables).cur;
          if (pcVar52 == (char *)0x0) {
LAB_00136b8d:
            ppvVar44 = (void **)0x0;
          }
          else {
            ppvVar44 = (void **)(pcVar52 + 0x48);
          }
LAB_00136b8f:
          pOVar37 = &null_entry;
          goto LAB_00136bba;
        }
        if (file->binary != 0) {
          __assert_fail("!fp->binary",
                        "/workspace/llm4binary/github/license_c_cmakelists/jplevyak[P]dparser/write_tables.c"
                        ,0x5dd,"void write_state_data(File *, Grammar *, VecState *, char *)");
        }
        myfprintf(file->fp,", %s");
      }
      if ((pSVar7->scanner).states.n == 0) {
        pcVar52 = (file->tables).cur;
        if (pcVar52 == (char *)0x0) {
          ppvVar44 = (void **)0x0;
        }
        else {
          ppvVar44 = (void **)(pcVar52 + 0x50);
        }
        pOVar37 = &null_entry;
      }
      else {
        print_no_comma(file,", (void*)");
        pcVar52 = (file->tables).cur;
        if (pcVar52 == (char *)0x0) {
          pOVar37 = get_offset(file,"d_scanner_%d_%s",(ulong)pSVar26->index,tag);
          ppvVar44 = (void **)0x0;
        }
        else {
          ppvVar44 = (void **)(pcVar52 + 0x50);
          pOVar37 = get_offset(file,"d_scanner_%d_%s",(ulong)pSVar26->index,tag);
        }
      }
      add_struct_ptr_member_fn(file,ppvVar44,pOVar37,"%s");
      if (file->binary == 0) {
        pFVar48 = file->fp;
        iVar16 = scanner_size(pSVar7);
        pcVar52 = make_type(iVar16);
        myfprintf(pFVar48,", sizeof(%s) ",pcVar52);
        if (file->binary != 0) {
          pcVar52 = (file->tables).cur;
          goto LAB_00136cac;
        }
        handle_comma(file);
        myfprintf(file->fp,"%d",(ulong)((byte)pSVar7->field_0x178 & 1));
        if (file->binary != 0) {
          pcVar52 = (file->tables).cur;
          goto LAB_00136cb8;
        }
        handle_comma(file);
        myfprintf(file->fp,*(char **)((long)scan_kind_strings +
                                     (ulong)((byte)pSVar7->field_0x178 & 0x38)));
      }
      else {
        iVar16 = scanner_size(pSVar7);
        pcVar52 = (file->tables).cur;
        pcVar52[0x58] = (char)iVar16;
LAB_00136cac:
        pcVar52[0x59] = pSVar7->field_0x178 & 1;
LAB_00136cb8:
        pcVar52[0x5a] = (byte)pSVar7->field_0x178 >> 3 & 7;
      }
      if (((pSVar26->field_0x178 & 0x78) == 8) || ((pSVar26->scanner).states.n == 0)) {
        pcVar52 = (file->tables).cur;
        if (pcVar52 == (char *)0x0) {
          ppvVar44 = (void **)0x0;
        }
        else {
          ppvVar44 = (void **)(pcVar52 + 0x60);
        }
        add_struct_ptr_member_fn(file,ppvVar44,&null_entry,"%s");
      }
      else {
        print_no_comma(file,", (void*)");
        pcVar52 = (file->tables).cur;
        if (pcVar52 == (char *)0x0) {
          pOVar37 = get_offset(file,"d_transition_%d_%s",(ulong)pSVar26->index,tag);
          ppvVar44 = (void **)0x0;
        }
        else {
          ppvVar44 = (void **)(pcVar52 + 0x60);
          pOVar37 = get_offset(file,"d_transition_%d_%s",(ulong)pSVar26->index,tag);
        }
        add_struct_ptr_member_fn(file,ppvVar44,pOVar37,"%s");
      }
      if (((pSVar26->field_0x178 & 0x78) == 8) || ((pSVar26->scanner).states.n == 0)) {
        pcVar52 = (file->tables).cur;
        if (pcVar52 == (char *)0x0) {
          ppvVar44 = (void **)0x0;
        }
        else {
          ppvVar44 = (void **)(pcVar52 + 0x68);
        }
        add_struct_ptr_member_fn(file,ppvVar44,&null_entry,"%s");
      }
      else {
        pcVar52 = (file->tables).cur;
        if (pcVar52 == (char *)0x0) {
          pOVar37 = get_offset(file,"d_accepts_diff_%d_%s",(ulong)pSVar26->index,tag);
          ppvVar44 = (void **)0x0;
        }
        else {
          ppvVar44 = (void **)(pcVar52 + 0x68);
          pOVar37 = get_offset(file,"d_accepts_diff_%d_%s",(ulong)pSVar26->index,tag);
        }
        add_struct_ptr_member_fn(file,ppvVar44,pOVar37,"%s");
      }
      if (pSVar7->reduces_to == (State *)0x0) {
        if (file->binary == 0) {
          handle_comma(file);
          pFVar48 = file->fp;
          uVar51 = 0xffffffffffffffff;
          goto LAB_00136ecc;
        }
        pcVar52 = (file->tables).cur;
        pcVar52[0x70] = -1;
        pcVar52[0x71] = -1;
        pcVar52[0x72] = -1;
        pcVar52[0x73] = -1;
      }
      else if (file->binary == 0) {
        handle_comma(file);
        pFVar48 = file->fp;
        uVar51 = (ulong)pSVar7->reduces_to->index;
LAB_00136ecc:
        myfprintf(pFVar48,"%d",uVar51);
      }
      else {
        *(uint *)((file->tables).cur + 0x70) = pSVar7->reduces_to->index;
      }
      pcVar52 = ",\n";
      if (uVar50 == (g->states).n - 1) {
        pcVar52 = "\n";
      }
      end_struct_in_array(file,pcVar52);
    }
    end_array(file,"\n\n");
  }
  pcVar52 = make_name("d_symbols_%s",tag);
  start_array_fn(file,0x18,"","D_Symbol",pcVar52,"",0,"\n");
  g->write_line = g->write_line + 1;
  for (uVar50 = 0; uVar50 < (g->productions).n; uVar50 = uVar50 + 1) {
    pPVar18 = (g->productions).v[uVar50];
    uVar51 = 0xffffffff;
    if (((pPVar18->field_0x3c & 0x1c) == 0) && (uVar51 = 0xffffffff, pPVar18->elem != (Elem *)0x0))
    {
      uVar51 = (ulong)pPVar18->state->index;
    }
    start_struct_in_array(file);
    pPVar18 = (g->productions).v[uVar50];
    bVar15 = (byte)pPVar18->field_0x3c >> 2;
    uVar43 = bVar15 & 7;
    uVar53 = (ulong)uVar43;
    if (uVar43 - 2 < 2) {
      uVar53 = 2;
    }
    else if ((bVar15 & 7) != 0) {
      uVar53 = (ulong)((char)uVar43 == '\x04') + 1;
    }
    if (file->binary == 0) {
      handle_comma(file);
      myfprintf(file->fp,d_internal_rel + *(int *)(d_internal_rel + uVar53 * 4));
      piVar47 = (int *)(file->tables).cur;
      pPVar18 = (g->productions).v[uVar50];
      if (piVar47 != (int *)0x0) goto LAB_001370bd;
      pcVar52 = pPVar18->name;
      ppcVar46 = (char **)0x0;
    }
    else {
      piVar47 = (int *)(file->tables).cur;
      *piVar47 = d_internal_values[uVar53];
LAB_001370bd:
      ppcVar46 = (char **)(piVar47 + 2);
      pcVar52 = pPVar18->name;
    }
    add_struct_str_member_fn(file,ppcVar46,pcVar52);
    if (file->binary == 0) {
      handle_comma(file);
      myfprintf(file->fp,"%d",(ulong)(g->productions).v[uVar50]->name_len);
      if (file->binary != 0) {
        pcVar52 = (file->tables).cur;
        goto LAB_00137121;
      }
      handle_comma(file);
      myfprintf(file->fp,"%d",uVar51);
    }
    else {
      pcVar52 = (file->tables).cur;
      *(uint *)(pcVar52 + 0x10) = (g->productions).v[uVar50]->name_len;
LAB_00137121:
      *(int *)(pcVar52 + 0x14) = (int)uVar51;
    }
    end_struct_in_array(file,",\n");
    g->write_line = g->write_line + 1;
  }
  for (uVar50 = 0; uVar50 < (g->terminals).n; uVar50 = uVar50 + 1) {
    pcVar22 = escape_string((g->terminals).v[uVar50]->string);
    pcVar28 = escape_string(pcVar22);
    pTVar19 = (g->terminals).v[uVar50];
    pcVar52 = pTVar19->term_name;
    if ((pcVar52 == (char *)0x0) && (pcVar52 = pcVar22, file->binary == 0)) {
      pcVar52 = pcVar28;
    }
    lVar39 = (long)(int)pTVar19->kind;
    start_struct_in_array(file);
    if (file->binary == 0) {
      handle_comma(file);
      myfprintf(file->fp,d_symbol_rel + *(int *)(d_symbol_rel + lVar39 * 4));
      piVar47 = (int *)(file->tables).cur;
      if (piVar47 != (int *)0x0) goto LAB_00137214;
      ppcVar46 = (char **)0x0;
    }
    else {
      piVar47 = (int *)(file->tables).cur;
      *piVar47 = d_symbol_values[lVar39];
LAB_00137214:
      ppcVar46 = (char **)(piVar47 + 2);
    }
    add_struct_str_member_fn(file,ppcVar46,pcVar52);
    if (file->binary == 0) {
      handle_comma(file);
      pFVar48 = file->fp;
      sVar29 = strlen(pcVar52);
      myfprintf(pFVar48,"%d",sVar29 & 0xffffffff);
      if (file->binary != 0) {
        pcVar52 = (file->tables).cur;
        goto LAB_0013727a;
      }
      handle_comma(file);
      myfprintf(file->fp,"%d",0xffffffffffffffff);
    }
    else {
      sVar29 = strlen(pcVar52);
      pcVar52 = (file->tables).cur;
      *(int *)(pcVar52 + 0x10) = (int)sVar29;
LAB_0013727a:
      pcVar52[0x14] = -1;
      pcVar52[0x15] = -1;
      pcVar52[0x16] = -1;
      pcVar52[0x17] = -1;
    }
    end_struct_in_array(file,",\n");
    g->write_line = g->write_line + 1;
    free(pcVar22);
    free(pcVar28);
  }
  end_array(file,"\n\n");
  g->write_line = g->write_line + 2;
  if ((g->passes).n != 0) {
    pcVar52 = make_name("d_passes_%s",tag);
    start_array_fn(file,0x18,"","D_Pass",pcVar52,"",0,"");
    g->write_line = g->write_line + 1;
    for (uVar50 = 0; uVar50 < (g->passes).n; uVar50 = uVar50 + 1) {
      pDVar13 = (g->passes).v[uVar50];
      start_struct_in_array(file);
      if (file != (File *)0x0) {
        ppcVar46 = (char **)(file->tables).cur;
        if (ppcVar46 == (char **)0x0) {
          ppcVar46 = (char **)0x0;
        }
        add_struct_str_member_fn(file,ppcVar46,pDVar13->name);
      }
      if (file->binary == 0) {
        handle_comma(file);
        myfprintf(file->fp,"%d",(ulong)pDVar13->name_len);
        if (file->binary != 0) {
          pcVar52 = (file->tables).cur;
          goto LAB_001373c7;
        }
        handle_comma(file);
        myfprintf(file->fp,"0x%x",(ulong)pDVar13->kind);
        if (file->binary != 0) {
          pcVar52 = (file->tables).cur;
          goto LAB_001373ce;
        }
        handle_comma(file);
        myfprintf(file->fp,"%d",(ulong)pDVar13->index);
      }
      else {
        pcVar52 = (file->tables).cur;
        *(uint *)(pcVar52 + 8) = pDVar13->name_len;
LAB_001373c7:
        *(uint *)(pcVar52 + 0xc) = pDVar13->kind;
LAB_001373ce:
        *(uint *)(pcVar52 + 0x10) = pDVar13->index;
      }
      pcVar52 = "";
      if (uVar50 < (g->passes).n - 1) {
        pcVar52 = ", ";
      }
      end_struct_in_array(file,pcVar52);
    }
    end_array(file,"\n\n");
    g->write_line = g->write_line + 2;
  }
  if (er_hash.v != er_hash.e && er_hash.v != (State **)0x0) {
    free(er_hash.v);
  }
  er_hash.n = 0;
  er_hash.v = (State **)0x0;
  pPVar18 = lookup_production(g,"whitespace",10);
  if (pPVar18 == (Production *)0x0) {
    uVar17 = 0;
  }
  else {
    uVar17 = pPVar18->state->index;
  }
  if (file->binary != 0) {
    file->d_parser_tables_loc = *(int *)&(file->tables).cur - *(int *)&(file->tables).start;
  }
  pcVar52 = make_name("parser_tables_%s",tag);
  start_struct_fn(file,0x48,"D_ParserTables",pcVar52,"\n");
  if (file->binary == 0) {
    handle_comma(file);
    myfprintf(file->fp,"%d",(ulong)(g->states).n);
    puVar42 = (uint *)(file->tables).cur;
    if (puVar42 != (uint *)0x0) goto LAB_00137539;
    pOVar37 = get_offset(file,"d_states_%s",tag);
    ppvVar44 = (void **)0x0;
  }
  else {
    puVar42 = (uint *)(file->tables).cur;
    *puVar42 = (g->states).n;
LAB_00137539:
    ppvVar44 = (void **)(puVar42 + 2);
    pOVar37 = get_offset(file,"d_states_%s",tag);
  }
  add_struct_ptr_member_fn(file,ppvVar44,pOVar37,"%s");
  pcVar52 = (file->tables).cur;
  if (pcVar52 == (char *)0x0) {
    pOVar37 = get_offset(file,"d_gotos_%s",tag);
    ppvVar44 = (void **)0x0;
  }
  else {
    ppvVar44 = (void **)(pcVar52 + 0x10);
    pOVar37 = get_offset(file,"d_gotos_%s",tag);
  }
  add_struct_ptr_member_fn(file,ppvVar44,pOVar37,"%s");
  if (file->binary == 0) {
    handle_comma(file);
    myfprintf(file->fp,"%d",(ulong)uVar17);
    if (file->binary != 0) goto LAB_001375fb;
    handle_comma(file);
    myfprintf(file->fp,"%d",(ulong)((g->terminals).n + (g->productions).n));
    pcVar52 = (file->tables).cur;
    if (pcVar52 != (char *)0x0) goto LAB_0013760f;
    pOVar37 = get_offset(file,"d_symbols_%s",tag);
    ppvVar44 = (void **)0x0;
  }
  else {
    *(uint *)((file->tables).cur + 0x18) = uVar17;
LAB_001375fb:
    pcVar52 = (file->tables).cur;
    *(uint *)(pcVar52 + 0x1c) = (g->terminals).n + (g->productions).n;
LAB_0013760f:
    ppvVar44 = (void **)(pcVar52 + 0x20);
    pOVar37 = get_offset(file,"d_symbols_%s",tag);
  }
  add_struct_ptr_member_fn(file,ppvVar44,pOVar37,"%s");
  if (g->default_white_space == (char *)0x0) {
    pcVar52 = (file->tables).cur;
    if (pcVar52 == (char *)0x0) {
      ppvVar44 = (void **)0x0;
    }
    else {
      ppvVar44 = (void **)(pcVar52 + 0x28);
    }
    add_struct_ptr_member_fn(file,ppvVar44,&null_entry,"%s");
  }
  else {
    if (file->binary != 0) {
      __assert_fail("!file->binary",
                    "/workspace/llm4binary/github/license_c_cmakelists/jplevyak[P]dparser/write_tables.c"
                    ,0x6a6,"void write_parser_tables(Grammar *, char *, File *)");
    }
    myfprintf(file->fp,", %s");
  }
  if (file->binary == 0) {
    handle_comma(file);
    myfprintf(file->fp,"%d",(ulong)(g->passes).n);
    uVar17 = (g->passes).n;
  }
  else {
    uVar17 = (g->passes).n;
    *(uint *)((file->tables).cur + 0x30) = uVar17;
  }
  pcVar52 = (file->tables).cur;
  if (uVar17 == 0) {
    if (pcVar52 == (char *)0x0) {
      pOVar37 = &null_entry;
      ppvVar44 = (void **)0x0;
    }
    else {
      ppvVar44 = (void **)(pcVar52 + 0x38);
      pOVar37 = &null_entry;
    }
  }
  else if (pcVar52 == (char *)0x0) {
    pOVar37 = get_offset(file,"d_passes_%s",tag);
    ppvVar44 = (void **)0x0;
  }
  else {
    ppvVar44 = (void **)(pcVar52 + 0x38);
    pOVar37 = get_offset(file,"d_passes_%s",tag);
  }
  add_struct_ptr_member_fn(file,ppvVar44,pOVar37,"%s");
  pcVar52 = extraout_RDX_05;
  if (g->save_parse_tree == 0) {
    if (file->binary != 0) {
      pcVar22 = (file->tables).cur;
      pcVar22[0x40] = '\0';
      pcVar22[0x41] = '\0';
      pcVar22[0x42] = '\0';
      pcVar22[0x43] = '\0';
      goto LAB_0013785d;
    }
    handle_comma(file);
    pFVar48 = file->fp;
    uVar40 = 0;
  }
  else {
    if (file->binary != 0) {
      pcVar22 = (file->tables).cur;
      pcVar22[0x40] = '\x01';
      pcVar22[0x41] = '\0';
      pcVar22[0x42] = '\0';
      pcVar22[0x43] = '\0';
      goto LAB_0013785d;
    }
    handle_comma(file);
    pFVar48 = file->fp;
    uVar40 = 1;
  }
  myfprintf(pFVar48,"%d",uVar40);
  pcVar52 = extraout_RDX_06;
LAB_0013785d:
  end_struct_fn(file,0x48,pcVar52);
  if (file->binary != 0) {
    if (file->str == (uint8 **)0x0) {
      pFVar30 = fopen(g->write_pathname,"wb");
      file->fp = (FILE *)pFVar30;
      if (pFVar30 == (FILE *)0x0) {
        d_fail("unable to open `%s` for write\n",g->pathname);
      }
    }
    final_code._0_4_ = (file->relocations).n;
    final_code._4_4_ = (file->str_relocations).n;
    lVar39 = (long)(file->tables).cur - (long)(file->tables).start;
    uVar36 = (undefined4)lVar39;
    final_code[0xc] = (char)uVar36;
    final_code[0xd] = (char)((uint)uVar36 >> 8);
    final_code[0xe] = (char)((uint)uVar36 >> 0x10);
    final_code[0xf] = (char)((uint)uVar36 >> 0x18);
    final_code._8_4_ = file->d_parser_tables_loc;
    lVar38 = (long)(file->strings).cur - (long)(file->strings).start;
    final_code._16_4_ = (undefined4)lVar38;
    ppuVar14 = file->str;
    if (ppuVar14 != (uint8 **)0x0) {
      uVar50 = lVar38 + lVar39 + ((ulong)(uint)final_code._4_4_ + (ulong)(uint)final_code._0_4_) * 8
               + 0x14;
      puVar31 = (uint8 *)malloc(uVar50 & 0xffffffff);
      *ppuVar14 = puVar31;
      file->cur_str = puVar31;
      *file->str_len = (uint)uVar50;
    }
    write_chk(final_code,0x14,1,file);
    write_chk((file->tables).start,1,(long)(int)final_code._12_4_,file);
    write_chk((file->strings).start,1,(long)(int)final_code._16_4_,file);
    lVar39 = 0;
    for (uVar50 = 0; uVar50 < (file->relocations).n; uVar50 = uVar50 + 1) {
      write_chk((void *)((long)(file->relocations).v + lVar39),8,1,file);
      lVar39 = lVar39 + 8;
    }
    lVar39 = 0;
    for (uVar50 = 0; uVar50 < (file->str_relocations).n; uVar50 = uVar50 + 1) {
      write_chk((void *)((long)(file->str_relocations).v + lVar39),8,1,file);
      lVar39 = lVar39 + 8;
    }
  }
  free((file->tables).start);
  free((file->strings).start);
  ppcVar46 = (file->str_relocations).v;
  if (ppcVar46 != (file->str_relocations).e && ppcVar46 != (char **)0x0) {
    free(ppcVar46);
  }
  (file->str_relocations).n = 0;
  (file->str_relocations).v = (char **)0x0;
  ppcVar46 = (file->relocations).v;
  if (ppcVar46 != (file->relocations).e && ppcVar46 != (char **)0x0) {
    free(ppcVar46);
  }
  (file->relocations).n = 0;
  (file->relocations).v = (char **)0x0;
  for (uVar50 = 0; __ptr = (file->entries).v, uVar50 < (file->entries).n; uVar50 = uVar50 + 1) {
    if (__ptr[uVar50] != (OffsetEntry *)0x0) {
      free(__ptr[uVar50]->name);
      free((file->entries).v[uVar50]);
      (file->entries).v[uVar50] = (OffsetEntry *)0x0;
    }
  }
  if (__ptr != (file->entries).e && __ptr != (OffsetEntry **)0x0) {
    free(__ptr);
  }
  (file->entries).n = 0;
  (file->entries).v = (OffsetEntry **)0x0;
  if ((FILE *)file->fp != (FILE *)0x0) {
    fclose((FILE *)file->fp);
  }
  return;
code_r0x00135be8:
  *(ulong *)(final_code._8_8_ + (ulong)uVar41 * 8) =
       (ulong)((pSVar7->gotos).v[lVar39]->state->index + 1);
  lVar39 = lVar39 + 1;
  goto LAB_00135b57;
}

Assistant:

void write_parser_tables(Grammar *g, char *tag, File *file) {
  int whitespace_production = 0;
  VecState er_hash;
  Production *p;
  vec_clear(&er_hash);

  g->scanner_block_size = 256 / g->scanner_blocks;

  write_reductions(file, g, tag);
  write_scanner_data(file, g, tag);
  if (!file->binary) write_scanner_code(file, g, tag);
  write_goto_data(file, g, tag);
  write_error_data(file, g, &er_hash, tag);
  write_state_data(file, g, &er_hash, tag);
  write_symbol_data(file, g, tag);
  write_passes(file, g, tag);
  vec_free(&er_hash);

  if ((p = lookup_production(g, "whitespace", sizeof("whitespace") - 1))) whitespace_production = p->state->index;

  if (file->binary) {
    file->d_parser_tables_loc = file->tables.cur - file->tables.start;
  }

  start_struct(file, D_ParserTables, make_name("parser_tables_%s", tag), "\n");
  add_struct_member(file, D_ParserTables, "%d", g->states.n, nstates);
  add_struct_ptr_member(file, D_ParserTables, "", get_offset(file, "d_states_%s", tag), state);
  add_struct_ptr_member(file, D_ParserTables, "", get_offset(file, "d_gotos_%s", tag), goto_table);
  add_struct_member(file, D_ParserTables, "%d", whitespace_production, whitespace_state);
  add_struct_member(file, D_ParserTables, "%d", g->productions.n + g->terminals.n, nsymbols);
  add_struct_ptr_member(file, D_ParserTables, "", get_offset(file, "d_symbols_%s", tag), symbols);
  if (g->default_white_space) {
    assert(!file->binary);
    fprintf(file->fp, ", %s", g->default_white_space);
  } else {
    add_struct_ptr_member(file, D_ParserTables, "", &null_entry, default_white_space);
  }
  add_struct_member(file, D_ParserTables, "%d", g->passes.n, npasses);
  if (g->passes.n){
    add_struct_ptr_member(file, D_ParserTables, "", get_offset(file, "d_passes_%s", tag), passes);
  } else {
    add_struct_ptr_member(file, D_ParserTables, "", &null_entry, passes);
  }
  if (g->save_parse_tree) {
    add_struct_member(file, D_ParserTables, "%d", 1, save_parse_tree);
  } else {
    add_struct_member(file, D_ParserTables, "%d", 0, save_parse_tree);
  }
  end_struct(file, D_ParserTables, "\n");

  if (file->binary) {
    if (!file->str) {
      file->fp = fopen(g->write_pathname, "wb");
      if (!file->fp) d_fail("unable to open `%s` for write\n", g->pathname);
    }
    save_binary_tables(file);
  }
  free_tables(file);
  if (file->fp) fclose(file->fp);
}